

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O3

void __thiscall Pl_AES_PDF::initializeVector(Pl_AES_PDF *this)

{
  uchar *data;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  if (this->use_zero_iv == true) {
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    if (this->use_specified_iv != true) {
      data = this->cbc_block;
      if (use_static_iv) {
        data[0] = '\x0e';
        data[1] = '\x1c';
        data[2] = '*';
        data[3] = '8';
        data[4] = 'F';
        data[5] = 'T';
        data[6] = 'b';
        data[7] = 'p';
        this->cbc_block[8] = '~';
        this->cbc_block[9] = 0x8c;
        this->cbc_block[10] = 0x9a;
        this->cbc_block[0xb] = 0xa8;
        this->cbc_block[0xc] = 0xb6;
        this->cbc_block[0xd] = 0xc4;
        this->cbc_block[0xe] = 0xd2;
        this->cbc_block[0xf] = 0xe0;
        return;
      }
      QUtil::initializeWithRandomBytes(data,0x10);
      return;
    }
    uVar1 = *(undefined4 *)this->specified_iv;
    uVar2 = *(undefined4 *)(this->specified_iv + 4);
    uVar3 = *(undefined4 *)(this->specified_iv + 8);
    uVar4 = *(undefined4 *)(this->specified_iv + 0xc);
  }
  *(undefined4 *)this->cbc_block = uVar1;
  *(undefined4 *)(this->cbc_block + 4) = uVar2;
  *(undefined4 *)(this->cbc_block + 8) = uVar3;
  *(undefined4 *)(this->cbc_block + 0xc) = uVar4;
  return;
}

Assistant:

void
Pl_AES_PDF::initializeVector()
{
    if (use_zero_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = 0;
        }
    } else if (use_specified_iv) {
        std::memcpy(this->cbc_block, this->specified_iv, this->buf_size);
    } else if (use_static_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = static_cast<unsigned char>(14U * (1U + i));
        }
    } else {
        QUtil::initializeWithRandomBytes(this->cbc_block, this->buf_size);
    }
}